

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O2

HighsModelStatus * __thiscall Highs::getModelStatus(Highs *this,bool param_1)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string
            ((string *)&local_28,"getModelStatus(const bool scaled_model)",&local_49);
  std::__cxx11::string::string((string *)&local_48,"getModelStatus()",&local_4a);
  deprecationMessage(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return &this->model_status_;
}

Assistant:

const HighsModelStatus& Highs::getModelStatus(const bool) const {
  deprecationMessage("getModelStatus(const bool scaled_model)",
                     "getModelStatus()");
  return model_status_;
}